

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

bool __thiscall Json::Value::operator<(Value *this,Value *other)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ushort uVar9;
  uint *__s;
  uint uVar10;
  uint *__s_00;
  bool bVar11;
  size_t sVar8;
  
  uVar1 = *(ushort *)&this->bits_;
  uVar2 = *(ushort *)&other->bits_;
  uVar9 = uVar2 & 0xff;
  bVar11 = (uVar1 & 0xff) < uVar9;
  if ((uVar1 & 0xff) == uVar9) {
    switch((char)uVar1) {
    case '\0':
      bVar11 = false;
      break;
    case '\x01':
      bVar11 = (this->value_).int_ < (other->value_).int_;
      break;
    case '\x02':
      bVar11 = (this->value_).uint_ < (other->value_).uint_;
      break;
    case '\x03':
      bVar11 = (this->value_).real_ <= (other->value_).real_ &&
               (other->value_).real_ != (this->value_).real_;
      break;
    case '\x04':
      __s = (uint *)(this->value_).string_;
      __s_00 = (uint *)(other->value_).string_;
      if (__s_00 == (uint *)0x0 || __s == (uint *)0x0) {
        bVar11 = __s_00 != (uint *)0x0;
      }
      else {
        if ((uVar1 >> 8 & 1) == 0) {
          sVar8 = strlen((char *)__s);
          uVar6 = (uint)sVar8;
        }
        else {
          uVar6 = *__s;
          __s = __s + 1;
        }
        if ((uVar2 >> 8 & 1) == 0) {
          sVar8 = strlen((char *)__s_00);
          uVar10 = (uint)sVar8;
        }
        else {
          uVar10 = *__s_00;
          __s_00 = __s_00 + 1;
        }
        uVar5 = uVar6;
        if (uVar10 < uVar6) {
          uVar5 = uVar10;
        }
        iVar7 = memcmp(__s,__s_00,(ulong)uVar5);
        bVar11 = true;
        if (-1 < iVar7) {
          bVar11 = uVar6 < uVar10 && iVar7 == 0;
        }
      }
      break;
    case '\x05':
      bVar11 = (this->value_).bool_ < (other->value_).bool_;
      break;
    case '\x06':
    case '\a':
      uVar3 = (((other->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      uVar4 = (((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      bVar11 = uVar4 < uVar3;
      if (uVar4 == uVar3) {
        bVar11 = std::operator<(&((this->value_).map_)->_M_t,&((other->value_).map_)->_M_t);
        return bVar11;
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/external/jsoncpp/src/lib_json/json_value.cpp"
                    ,0x217,"bool Json::Value::operator<(const Value &) const");
    }
  }
  return bVar11;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}